

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

InterpolationType __thiscall
soul::StructuralParser::parseOptionalInterpolationType(StructuralParser *this)

{
  bool bVar1;
  InterpolationType type;
  StructuralParser *this_local;
  
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d443d);
  if (bVar1) {
    this_local._4_4_ = parseInterpolationType<soul::StructuralParser>(this);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d398a);
  }
  else {
    this_local._4_4_ = none;
  }
  return this_local._4_4_;
}

Assistant:

InterpolationType parseOptionalInterpolationType()
    {
        if (! matchIf (Operator::openBracket))
            return InterpolationType::none;

        auto type = parseInterpolationType (*this);
        expect (Operator::closeBracket);
        return type;
    }